

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O1

atom_server init_atom_server(atom_cache_type cache_style)

{
  int iVar1;
  uint32_t atom;
  in_addr_t iVar2;
  atom_server as;
  char *pcVar3;
  hostent *phVar4;
  in_addr_t *__dest;
  long lVar5;
  
  as = (atom_server)malloc(0xd8);
  if (atom_server_host == (char *)0x0) {
    atom_server_host = getenv("ATOM_SERVER_HOST");
  }
  if (atom_server_host == (char *)0x0) {
    atom_server_host = "atomhost.cercs.gatech.edu";
  }
  as->server_id = atom_server_host;
  as->tcp_fd = -1;
  pcVar3 = getenv("ATL_USE_TCP");
  as->use_tcp = (uint)(pcVar3 != (char *)0x0);
  as->no_server = 1;
  Tcl_InitHashTable(&as->string_hash_table,0);
  Tcl_InitHashTable(&as->value_hash_table,1);
  phVar4 = gethostbyname(atom_server_host);
  as->he = (hostent *)phVar4;
  if (phVar4 == (hostent *)0x0) {
    as->he = (hostent *)0x0;
    (as->their_addr).sin_addr.s_addr = 0;
  }
  else {
    (as->their_addr).sin_addr.s_addr = *(in_addr_t *)*phVar4->h_addr_list;
  }
  __dest = (in_addr_t *)0x2;
  pcVar3 = (char *)0x2;
  iVar1 = socket(2,2,0);
  as->sockfd = iVar1;
  if (iVar1 == -1) {
    init_atom_server_cold_1();
    phVar4 = gethostbyname(pcVar3);
    if (phVar4 == (hostent *)0x0) {
      iVar2 = inet_addr(pcVar3);
      if (iVar2 == 0xffffffff) {
        return (atom_server)0x0;
      }
      *__dest = iVar2;
    }
    else {
      memcpy(__dest,*phVar4->h_addr_list,(long)phVar4->h_length);
    }
    return (atom_server)0x1;
  }
  lVar5 = 0;
  iVar1 = fcntl(iVar1,3);
  as->flags = iVar1;
  (as->their_addr).sin_family = 2;
  (as->their_addr).sin_port = 0x5c11;
  (as->their_addr).sin_zero[0] = '\0';
  (as->their_addr).sin_zero[1] = '\0';
  (as->their_addr).sin_zero[2] = '\0';
  (as->their_addr).sin_zero[3] = '\0';
  (as->their_addr).sin_zero[4] = '\0';
  (as->their_addr).sin_zero[5] = '\0';
  (as->their_addr).sin_zero[6] = '\0';
  (as->their_addr).sin_zero[7] = '\0';
  do {
    pcVar3 = *(char **)((long)in_use_values + lVar5);
    atom = ATLget_hash(pcVar3);
    set_string_and_atom(as,pcVar3,atom);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x268);
  as->no_server = 0;
  return as;
}

Assistant:

atom_server
init_atom_server(atom_cache_type cache_style)
{
    atom_server as = (atom_server) malloc(sizeof(atom_server_struct));

    nt_socket_init_func();
    if (atom_server_host == NULL) {	/* environment override */
	atom_server_host = getenv("ATOM_SERVER_HOST");
    }
    if (atom_server_host == NULL) {
	atom_server_host = ATOM_SERVER_HOST;	/* from configure */
    }
    as->server_id = atom_server_host;
    as->tcp_fd = -1;
    as->use_tcp = (getenv("ATL_USE_TCP") != NULL);
    as->no_server = 1;

    Tcl_InitHashTable(&as->string_hash_table, TCL_STRING_KEYS);
    Tcl_InitHashTable(&as->value_hash_table, TCL_ONE_WORD_KEYS);

    if ((as->he = gethostbyname(atom_server_host)) == NULL) {
	as->he = NULL;
	as->their_addr.sin_addr.s_addr = 0;
    } else {
	as->their_addr.sin_addr = *((struct in_addr *) as->he->h_addr);
    }
    if ((as->sockfd = (int) socket(AF_INET, SOCK_DGRAM, 0)) == -1) {
	perror("socket");
	exit(1);
    }
#ifndef HAVE_WINDOWS_H
    as->flags = fcntl(as->sockfd, F_GETFL);
#else
    as->flags = 0;
#endif
    as->their_addr.sin_family = AF_INET;
    as->their_addr.sin_port = htons(UDP_PORT);
    memset(&(as->their_addr.sin_zero), '\0', 8);

    preload_in_use_atoms(as);
    as->no_server = 0;
    return as;
}